

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O1

CappedArray<char,_24UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_24UL> *__return_storage_ptr__,Stringifier *this,float f)

{
  char *__s;
  int *piVar1;
  size_t sVar2;
  bool bVar3;
  float fVar4;
  char *endptr;
  char *local_28;
  
  __return_storage_ptr__->currentSize = 0x18;
  __s = __return_storage_ptr__->content;
  if (INFINITY <= f) {
    builtin_strncpy(__s,"inf",4);
    goto LAB_0017c990;
  }
  if (f <= -INFINITY) {
    builtin_strncpy(__s,"-inf",5);
    goto LAB_0017c990;
  }
  if (NAN(f)) {
    builtin_strncpy(__s,"nan",4);
    goto LAB_0017c990;
  }
  bVar3 = true;
  snprintf(__s,0x18,"%.*g",6);
  piVar1 = __errno_location();
  *piVar1 = 0;
  fVar4 = strtof(__s,&local_28);
  if ((*__s != '\0') && (*local_28 == '\0')) {
    bVar3 = *piVar1 != 0;
  }
  if (bVar3) {
LAB_0017c95f:
    snprintf(__s,0x18,"%.*g",(double)f,8);
  }
  else if ((fVar4 != f) || (NAN(fVar4) || NAN(f))) goto LAB_0017c95f;
  anon_unknown_1::DelocalizeRadix(__s);
  anon_unknown_1::RemovePlus(__s);
LAB_0017c990:
  sVar2 = strlen(__s);
  __return_storage_ptr__->currentSize = sVar2;
  return __return_storage_ptr__;
}

Assistant:

CappedArray<char, kFloatToBufferSize> Stringifier::operator*(float f) const {
  CappedArray<char, kFloatToBufferSize> result;
  result.setSize(strlen(FloatToBuffer(f, result.begin())));
  return result;
}